

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

Scl_Pair_t Scl_LibertyUpdateHead(Scl_Tree_t *p,Scl_Pair_t Head)

{
  char *pcVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  byte bVar8;
  
  uVar6 = Head.Beg;
  pcVar1 = p->pContents;
  if ((long)(int)uVar6 < (long)Head >> 0x20) {
    pbVar7 = (byte *)(pcVar1 + (int)uVar6);
    pbVar4 = (byte *)0x0;
    pbVar3 = (byte *)0x0;
    do {
      bVar8 = *pbVar7;
      if (bVar8 == 10) {
        p->nLines = p->nLines + 1;
        bVar8 = *pbVar7;
      }
      if ((((0x20 < bVar8) || ((0x100002600U >> ((ulong)bVar8 & 0x3f) & 1) == 0)) && (bVar8 != 0x5c)
          ) && (pbVar4 = pbVar7, pbVar3 == (byte *)0x0)) {
        pbVar3 = pbVar7;
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 < pcVar1 + ((long)Head >> 0x20));
  }
  else {
    pbVar3 = (byte *)0x0;
    pbVar4 = (byte *)0x0;
  }
  uVar5 = (ulong)(((int)pbVar4 - (int)pcVar1) + 1);
  uVar2 = (int)pbVar3 - (int)pcVar1;
  if (pbVar4 == (byte *)0x0 || pbVar3 == (byte *)0x0) {
    uVar5 = (ulong)Head >> 0x20;
    uVar2 = uVar6;
  }
  return (Scl_Pair_t)((ulong)uVar2 | uVar5 << 0x20);
}

Assistant:

static inline Scl_Pair_t Scl_LibertyUpdateHead( Scl_Tree_t * p, Scl_Pair_t Head )
{
    Scl_Pair_t Res;
    char * pBeg = p->pContents + Head.Beg;
    char * pEnd = p->pContents + Head.End;
    char * pFirstNonSpace = NULL;
    char * pLastNonSpace = NULL;
    char * pChar;
    for ( pChar = pBeg; pChar < pEnd; pChar++ )
    {
        if ( *pChar == '\n' )
            p->nLines++;
        if ( Scl_LibertyCharIsSpace(*pChar) )
            continue;
        pLastNonSpace = pChar;
        if ( pFirstNonSpace == NULL )
            pFirstNonSpace = pChar;
    }
    if ( pFirstNonSpace == NULL || pLastNonSpace == NULL )
        return Head;
    assert( pFirstNonSpace && pLastNonSpace );
    Res.Beg = pFirstNonSpace - p->pContents;
    Res.End = pLastNonSpace  - p->pContents + 1;
    return Res;
}